

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::Enqueue(Worker *this,ptr_t *req)

{
  std::mutex::lock(&this->mutex_);
  PrepareThread(this);
  std::
  deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
  ::emplace_back<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>
            ((deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
              *)&this->queue_,req);
  Signaler::Signal(&this->signal_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void Enqueue(Request::ptr_t req) {
            RESTINCURL_LOG_TRACE("Queuing request ");
            lock_t lock(mutex_);
            PrepareThread();
            queue_.push_back(std::move(req));
            Signal();
        }